

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBytField.cpp
# Opt level: O0

void __thiscall
ki::dml::Field<unsigned_char>::read_from(Field<unsigned_char> *this,istream *istream)

{
  ulong uVar1;
  ostream *poVar2;
  parse_error *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  ValueBytes<unsigned_char> local_19;
  istream *piStack_18;
  ValueBytes<unsigned_char> data;
  istream *istream_local;
  Field<unsigned_char> *this_local;
  
  piStack_18 = istream;
  istream_local = (istream *)this;
  ValueBytes<unsigned_char>::ValueBytes(&local_19);
  std::istream::read((char *)piStack_18,(long)&local_19);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    this->m_value = (uchar)local_19;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"Not enough data was available to read UBYT value ("
                          );
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_FieldBase).m_name);
  std::operator<<(poVar2,").");
  this_00 = (parse_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  parse_error::parse_error(this_00,local_1c8);
  __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void UBytField::read_from(std::istream &istream)
	{
		ValueBytes<UBYT> data;
		istream.read(data.buff, sizeof(UBYT));
		if (istream.fail())
		{
			std::ostringstream oss;
			oss << "Not enough data was available to read UBYT value (" << m_name << ").";
			throw parse_error(oss.str());
		}
		m_value = data.value;
	}